

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boost_unordered.hpp
# Opt level: O2

void boost::unordered::detail::foa::
     table_arrays<std::pair<const_void_*const,_std::span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_void_*const,_std::span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL>_>_>_>
     ::delete_(undefined8 param_1,long param_2)

{
  ulong uVar1;
  
  if (*(void **)(param_2 + 0x18) != (void *)0x0) {
    uVar1 = *(long *)(param_2 + 8) * 0x178 + 0x186;
    operator_delete(*(void **)(param_2 + 0x18),uVar1 - uVar1 % 0x18);
    return;
  }
  return;
}

Assistant:

value_type* elements() const noexcept { return std::to_address(elements_); }